

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_valid_public_key(uint8_t *public_key,uECC_Curve curve)

{
  int iVar1;
  uECC_word_t local_58;
  uECC_word_t _public [8];
  uECC_Curve curve_local;
  uint8_t *public_key_local;
  
  _public[7] = (uECC_word_t)curve;
  uECC_vli_bytesToNative(&local_58,public_key,(int)curve->num_bytes);
  uECC_vli_bytesToNative
            (_public + (long)(int)*(char *)_public[7] + -1,
             public_key + (int)*(char *)(_public[7] + 1),(int)*(char *)(_public[7] + 1));
  iVar1 = uECC_valid_point(&local_58,(uECC_Curve)_public[7]);
  return iVar1;
}

Assistant:

int uECC_valid_public_key(const uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + curve->num_words, public_key + curve->num_bytes, curve->num_bytes);
#endif
    return uECC_valid_point(_public, curve);
}